

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SettingsHandlerWindow_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  undefined8 uVar1;
  ImGuiContext *this;
  int iVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindowSettings *pIVar4;
  ImGuiWindowSettings *local_60;
  ImGuiWindowSettings *settings_1;
  ImVec2ih local_48;
  int i_1;
  ImGuiWindowSettings *local_40;
  ImGuiWindowSettings *settings;
  ImGuiWindow *window;
  ImGuiContext *pIStack_28;
  int i;
  ImGuiContext *g;
  ImGuiTextBuffer *buf_local;
  ImGuiSettingsHandler *handler_local;
  ImGuiContext *ctx_local;
  
  window._4_4_ = 0;
  pIStack_28 = ctx;
  g = (ImGuiContext *)buf;
  buf_local = (ImGuiTextBuffer *)handler;
  handler_local = (ImGuiSettingsHandler *)ctx;
  do {
    this = g;
    if (window._4_4_ == (pIStack_28->Windows).Size) {
      iVar2 = ImGuiTextBuffer::size((ImGuiTextBuffer *)g);
      ImGuiTextBuffer::reserve
                ((ImGuiTextBuffer *)this,iVar2 + (pIStack_28->SettingsWindows).Size * 0x60);
      for (settings_1._4_4_ = 0; settings_1._4_4_ != (pIStack_28->SettingsWindows).Size;
          settings_1._4_4_ = settings_1._4_4_ + 1) {
        pIVar4 = ImVector<ImGuiWindowSettings>::operator[]
                           (&pIStack_28->SettingsWindows,settings_1._4_4_);
        uVar1._0_4_ = (buf_local->Buf).Size;
        uVar1._4_4_ = (buf_local->Buf).Capacity;
        ImGuiTextBuffer::appendf((ImGuiTextBuffer *)g,"[%s][%s]\n",uVar1,pIVar4->Name);
        ImGuiTextBuffer::appendf
                  ((ImGuiTextBuffer *)g,"Pos=%d,%d\n",(ulong)(uint)(int)(pIVar4->Pos).x,
                   (ulong)(uint)(int)(pIVar4->Pos).y);
        ImGuiTextBuffer::appendf
                  ((ImGuiTextBuffer *)g,"Size=%d,%d\n",(ulong)(uint)(int)(pIVar4->Size).x,
                   (ulong)(uint)(int)(pIVar4->Size).y);
        ImGuiTextBuffer::appendf
                  ((ImGuiTextBuffer *)g,"Collapsed=%d\n",(ulong)(pIVar4->Collapsed & 1));
        ImGuiTextBuffer::appendf((ImGuiTextBuffer *)g,"\n");
      }
      return;
    }
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIStack_28->Windows,window._4_4_);
    settings = (ImGuiWindowSettings *)*ppIVar3;
    if ((((ImGuiWindow *)settings)->Flags & 0x100U) == 0) {
      if (((ImGuiWindow *)settings)->SettingsIdx == -1) {
        local_60 = ImGui::FindWindowSettings(((ImGuiWindow *)settings)->ID);
      }
      else {
        local_60 = ImVector<ImGuiWindowSettings>::operator[]
                             (&pIStack_28->SettingsWindows,((ImGuiWindow *)settings)->SettingsIdx);
      }
      local_40 = local_60;
      if (local_60 == (ImGuiWindowSettings *)0x0) {
        local_40 = ImGui::CreateNewWindowSettings(settings->Name);
        iVar2 = ImVector<ImGuiWindowSettings>::index_from_ptr(&pIStack_28->SettingsWindows,local_40)
        ;
        *(int *)((long)&settings[0x1c].Name + 4) = iVar2;
      }
      if (local_40->ID != settings->ID) {
        __assert_fail("settings->ID == window->ID",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                      ,0x249e,
                      "void SettingsHandlerWindow_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                     );
      }
      ImVec2ih::ImVec2ih((ImVec2ih *)&i_1,(short)(int)(float)settings->Size,
                         (short)(int)*(float *)&settings->Collapsed);
      (local_40->Pos).x = (undefined2)i_1;
      (local_40->Pos).y = i_1._2_2_;
      ImVec2ih::ImVec2ih(&local_48,(short)(int)(float)settings[1].ID,
                         (short)(int)(float)settings[1].Pos);
      local_40->Size = local_48;
      local_40->Collapsed = (bool)(*(byte *)((long)&settings[5].ID + 1) & 1);
    }
    window._4_4_ = window._4_4_ + 1;
  } while( true );
}

Assistant:

static void SettingsHandlerWindow_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsIdx != -1) ? &g.SettingsWindows[window->SettingsIdx] : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsIdx = g.SettingsWindows.index_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih((short)window->Pos.x, (short)window->Pos.y);
        settings->Size = ImVec2ih((short)window->SizeFull.x, (short)window->SizeFull.y);
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.Size * 96); // ballpark reserve
    for (int i = 0; i != g.SettingsWindows.Size; i++)
    {
        const ImGuiWindowSettings* settings = &g.SettingsWindows[i];
        buf->appendf("[%s][%s]\n", handler->TypeName, settings->Name);
        buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->appendf("\n");
    }
}